

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

int RGBColorMatrix(uint8_t *dst_argb,int dst_stride_argb,int8_t *matrix_rgb,int dst_x,int dst_y,
                  int width,int height)

{
  int in_ECX;
  char *in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  uint8_t *dst;
  int8_t matrix_argb [16];
  int in_stack_ffffffffffffff6c;
  int8_t *in_stack_ffffffffffffff70;
  uint8_t *in_stack_ffffffffffffff90;
  int local_34;
  
  if ((((in_RDI == 0) || (in_RDX == (char *)0x0)) || (in_R9D < 1)) ||
     (((in_stack_00000008 < 1 || (in_ECX < 0)) || (in_R8D < 0)))) {
    local_34 = -1;
  }
  else {
    local_34 = ARGBColorMatrix(in_stack_ffffffffffffff90,0x40000000,
                               (uint8_t *)
                               CONCAT17(in_RDX[7] / '\x02',
                                        CONCAT16(in_RDX[6] / '\x02',
                                                 CONCAT15(in_RDX[5] / '\x02',
                                                          CONCAT14(in_RDX[4] / '\x02',
                                                                   CONCAT13(in_RDX[3] / '\x02',
                                                                            CONCAT12(in_RDX[2] /
                                                                                     '\x02',CONCAT11
                                                  (in_RDX[1] / '\x02',*in_RDX / '\x02'))))))),
                               (int)((ulong)(in_RDI + in_R8D * in_ESI + (long)(in_ECX << 2)) >> 0x20
                                    ),in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_R8D);
  }
  return local_34;
}

Assistant:

LIBYUV_API
int RGBColorMatrix(uint8_t* dst_argb,
                   int dst_stride_argb,
                   const int8_t* matrix_rgb,
                   int dst_x,
                   int dst_y,
                   int width,
                   int height) {
  SIMD_ALIGNED(int8_t matrix_argb[16]);
  uint8_t* dst = dst_argb + dst_y * dst_stride_argb + dst_x * 4;
  if (!dst_argb || !matrix_rgb || width <= 0 || height <= 0 || dst_x < 0 ||
      dst_y < 0) {
    return -1;
  }

  // Convert 4x3 7 bit matrix to 4x4 6 bit matrix.
  matrix_argb[0] = matrix_rgb[0] / 2;
  matrix_argb[1] = matrix_rgb[1] / 2;
  matrix_argb[2] = matrix_rgb[2] / 2;
  matrix_argb[3] = matrix_rgb[3] / 2;
  matrix_argb[4] = matrix_rgb[4] / 2;
  matrix_argb[5] = matrix_rgb[5] / 2;
  matrix_argb[6] = matrix_rgb[6] / 2;
  matrix_argb[7] = matrix_rgb[7] / 2;
  matrix_argb[8] = matrix_rgb[8] / 2;
  matrix_argb[9] = matrix_rgb[9] / 2;
  matrix_argb[10] = matrix_rgb[10] / 2;
  matrix_argb[11] = matrix_rgb[11] / 2;
  matrix_argb[14] = matrix_argb[13] = matrix_argb[12] = 0;
  matrix_argb[15] = 64;  // 1.0

  return ARGBColorMatrix((const uint8_t*)(dst), dst_stride_argb, dst,
                         dst_stride_argb, &matrix_argb[0], width, height);
}